

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

bool llvm::AArch64::getExtensionFeatures
               (uint Extensions,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  pointer *ppSVar1;
  iterator iVar2;
  StringRef local_20;
  
  if (Extensions != 0) {
    if ((Extensions & 8) != 0) {
      local_20.Data = "+fp-armv8";
      local_20.Length = 9;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+fp-armv8";
        (iVar2._M_current)->Length = 9;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions & 0x10) != 0) {
      local_20.Data = "+neon";
      local_20.Length = 5;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+neon";
        (iVar2._M_current)->Length = 5;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions & 2) != 0) {
      local_20.Data = "+crc";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+crc";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions & 4) != 0) {
      local_20.Data = "+crypto";
      local_20.Length = 7;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+crypto";
        (iVar2._M_current)->Length = 7;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions >> 10 & 1) != 0) {
      local_20.Data = "+dotprod";
      local_20.Length = 8;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+dotprod";
        (iVar2._M_current)->Length = 8;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions & 0x20) != 0) {
      local_20.Data = "+fullfp16";
      local_20.Length = 9;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+fullfp16";
        (iVar2._M_current)->Length = 9;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions & 0x40) != 0) {
      local_20.Data = "+spe";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+spe";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((char)Extensions < '\0') {
      local_20.Data = "+ras";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+ras";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions >> 8 & 1) != 0) {
      local_20.Data = "+lse";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+lse";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions >> 0xc & 1) != 0) {
      local_20.Data = "+rdm";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+rdm";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions >> 9 & 1) != 0) {
      local_20.Data = "+sve";
      local_20.Length = 4;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+sve";
        (iVar2._M_current)->Length = 4;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    if ((Extensions >> 0xb & 1) != 0) {
      local_20.Data = "+rcpc";
      local_20.Length = 5;
      iVar2._M_current =
           (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
        _M_realloc_insert<llvm::StringRef>(Features,iVar2,&local_20);
      }
      else {
        (iVar2._M_current)->Data = "+rcpc";
        (iVar2._M_current)->Length = 5;
        ppSVar1 = &(Features->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
  }
  return Extensions != 0;
}

Assistant:

bool llvm::AArch64::getExtensionFeatures(unsigned Extensions,
                                     std::vector<StringRef> &Features) {

  if (Extensions == AArch64::AEK_INVALID)
    return false;

  if (Extensions & AArch64::AEK_FP)
    Features.push_back("+fp-armv8");
  if (Extensions & AArch64::AEK_SIMD)
    Features.push_back("+neon");
  if (Extensions & AArch64::AEK_CRC)
    Features.push_back("+crc");
  if (Extensions & AArch64::AEK_CRYPTO)
    Features.push_back("+crypto");
  if (Extensions & AArch64::AEK_DOTPROD)
    Features.push_back("+dotprod");
  if (Extensions & AArch64::AEK_FP16)
    Features.push_back("+fullfp16");
  if (Extensions & AArch64::AEK_PROFILE)
    Features.push_back("+spe");
  if (Extensions & AArch64::AEK_RAS)
    Features.push_back("+ras");
  if (Extensions & AArch64::AEK_LSE)
    Features.push_back("+lse");
  if (Extensions & AArch64::AEK_RDM)
    Features.push_back("+rdm");
  if (Extensions & AArch64::AEK_SVE)
    Features.push_back("+sve");
  if (Extensions & AArch64::AEK_RCPC)
    Features.push_back("+rcpc");

  return true;
}